

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9VmThrowError(jx9_vm *pVm,SyString *pFuncName,sxi32 iErr,char *zMessage)

{
  SyBlob *pBlob;
  uint uVar1;
  sxu32 sVar2;
  void *pvVar3;
  char *pcVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  
  if (pVm->bErrReport == 0) {
    return 0;
  }
  (pVm->sWorker).nByte = 0;
  uVar1 = (pVm->sWorker).nFlags;
  if ((uVar1 & 4) != 0) {
    (pVm->sWorker).pBlob = (void *)0x0;
    (pVm->sWorker).mByte = 0;
    (pVm->sWorker).nFlags = uVar1 & 0xfffffffb;
  }
  pBlob = &pVm->sWorker;
  sVar2 = (pVm->aFiles).nUsed;
  if ((sVar2 != 0) && (pvVar3 = (pVm->aFiles).pBase, pvVar3 != (void *)0x0)) {
    uVar6 = (ulong)((sVar2 - 1) * (pVm->aFiles).eSize);
    SyBlobAppend(pBlob,*(void **)((long)pvVar3 + uVar6),*(sxu32 *)((long)pvVar3 + uVar6 + 8));
    SyBlobAppend(pBlob," ",1);
  }
  pcVar7 = "Error: ";
  if (iErr == 3) {
    pcVar7 = "Notice: ";
  }
  pcVar8 = "Warning: ";
  if (iErr != 2) {
    pcVar8 = pcVar7;
  }
  pcVar7 = pcVar8;
  if (*pcVar8 != '\0') {
    pcVar4 = pcVar8 + 2;
    do {
      pcVar7 = pcVar4;
      if (pcVar7[-1] == '\0') {
        pcVar7 = pcVar7 + -1;
        goto LAB_0011c8b4;
      }
      if (*pcVar7 == '\0') goto LAB_0011c8b4;
      if (pcVar7[1] == '\0') {
        pcVar7 = pcVar7 + 1;
        goto LAB_0011c8b4;
      }
      pcVar4 = pcVar7 + 4;
    } while (pcVar7[2] != '\0');
    pcVar7 = pcVar7 + 2;
  }
LAB_0011c8b4:
  SyBlobAppend(pBlob,pcVar8,(int)pcVar7 - (int)pcVar8);
  if (pFuncName != (SyString *)0x0) {
    SyBlobAppend(pBlob,pFuncName->zString,pFuncName->nByte);
    SyBlobAppend(pBlob,"(): ",4);
  }
  pcVar7 = zMessage;
  if (*zMessage != '\0') {
    pcVar8 = zMessage + 2;
    do {
      pcVar7 = pcVar8;
      if (pcVar7[-1] == '\0') {
        pcVar7 = pcVar7 + -1;
        goto LAB_0011c924;
      }
      if (*pcVar7 == '\0') goto LAB_0011c924;
      if (pcVar7[1] == '\0') {
        pcVar7 = pcVar7 + 1;
        goto LAB_0011c924;
      }
      pcVar8 = pcVar7 + 4;
    } while (pcVar7[2] != '\0');
    pcVar7 = pcVar7 + 2;
  }
LAB_0011c924:
  SyBlobAppend(pBlob,zMessage,(int)pcVar7 - (int)zMessage);
  SyBlobAppend(pBlob,"\n",1);
  iVar5 = (*(pVm->sVmConsumer).xConsumer)
                    ((pVm->sWorker).pBlob,(pVm->sWorker).nByte,(pVm->sVmConsumer).pUserData);
  pVm->nOutputLen = pVm->nOutputLen + (pVm->sWorker).nByte;
  return iVar5;
}

Assistant:

JX9_PRIVATE sxi32 jx9VmThrowError(
	jx9_vm *pVm,         /* Target VM */
	SyString *pFuncName, /* Function name. NULL otherwise */
	sxi32 iErr,          /* Severity level: [i.e: Error, Warning or Notice]*/
	const char *zMessage /* Null terminated error message */
	)
{
	SyBlob *pWorker = &pVm->sWorker;
	SyString *pFile;
	char *zErr;
	sxi32 rc;
	if( !pVm->bErrReport ){
		/* Don't bother reporting errors */
		return SXRET_OK;
	}
	/* Reset the working buffer */
	SyBlobReset(pWorker);
	/* Peek the processed file if available */
	pFile = (SyString *)SySetPeek(&pVm->aFiles);
	if( pFile ){
		/* Append file name */
		SyBlobAppend(pWorker, pFile->zString, pFile->nByte);
		SyBlobAppend(pWorker, (const void *)" ", sizeof(char));
	}
	zErr = "Error: ";
	switch(iErr){
	case JX9_CTX_WARNING: zErr = "Warning: "; break;
	case JX9_CTX_NOTICE:  zErr = "Notice: ";  break;
	default:
		iErr = JX9_CTX_ERR;
		break;
	}
	SyBlobAppend(pWorker, zErr, SyStrlen(zErr));
	if( pFuncName ){
		/* Append function name first */
		SyBlobAppend(pWorker, pFuncName->zString, pFuncName->nByte);
		SyBlobAppend(pWorker, "(): ", sizeof("(): ")-1);
	}
	SyBlobAppend(pWorker, zMessage, SyStrlen(zMessage));
	/* Consume the error message */
	rc = VmCallErrorHandler(&(*pVm), pWorker);
	return rc;
}